

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_8x8avg
               (uint8_t *src_buf,int src_stride,uint8_t *dst_buf,int dst_stride,int x16_idx,
               int y16_idx,VP16x16 *vst,int highbd_flag,int pixels_wide,int pixels_high)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_R8D;
  int in_R9D;
  VP16x16 *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  undefined4 in_stack_00000020;
  int in_stack_00000048;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_stack_00000010 == 0) {
    fill_variance_8x8avg_lowbd
              (dst_buf,dst_stride,(uint8_t *)CONCAT44(y16_idx,in_stack_00000020),in_stack_0000001c,
               in_stack_00000018,in_stack_00000014,(VP16x16 *)src_buf,in_stack_00000048,(int)vst);
  }
  else {
    fill_variance_8x8avg_highbd
              ((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               (uint8_t *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  }
  return;
}

Assistant:

static inline void fill_variance_8x8avg(const uint8_t *src_buf, int src_stride,
                                        const uint8_t *dst_buf, int dst_stride,
                                        int x16_idx, int y16_idx, VP16x16 *vst,
                                        int highbd_flag, int pixels_wide,
                                        int pixels_high) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd_flag) {
    fill_variance_8x8avg_highbd(src_buf, src_stride, dst_buf, dst_stride,
                                x16_idx, y16_idx, vst, pixels_wide,
                                pixels_high);
    return;
  }
#else
  (void)highbd_flag;
#endif  // CONFIG_AV1_HIGHBITDEPTH
  fill_variance_8x8avg_lowbd(src_buf, src_stride, dst_buf, dst_stride, x16_idx,
                             y16_idx, vst, pixels_wide, pixels_high);
}